

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexSeparableKernel::downresU(PtexSeparableKernel *this)

{
  int i;
  float *dst;
  float *src;
  PtexSeparableKernel *this_local;
  
  src = this->ku;
  dst = this->ku;
  if ((this->u & 1U) != 0) {
    dst = dst + 1;
    src = src + 1;
    this->uw = this->uw + -1;
  }
  for (i = this->uw / 2; 0 < i; i = i + -1) {
    *dst = *src + src[1];
    src = src + 2;
    dst = dst + 1;
  }
  if ((this->uw & 1U) != 0) {
    *dst = *src;
    dst = dst + 1;
  }
  this->u = this->u / 2;
  this->uw = (int)((long)dst - (long)this->ku >> 2);
  (this->res).ulog2 = (this->res).ulog2 + -1;
  return;
}

Assistant:

void downresU()
    {
        float* src = ku;
        float* dst = ku;

        // skip odd leading sample (if any)
        if (u & 1) {
            dst++;
            src++;
            uw--;
        }

        // combine even pairs
        for (int i = uw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (uw & 1) {
            *dst++ = *src++;
        }

        // update state
        u /= 2;
        uw = int(dst - ku);
        res.ulog2--;
    }